

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindowPrivate::removeBaseWidget(QMdiSubWindowPrivate *this)

{
  QPointer<QWidget> *pQVar1;
  QObject *pQVar2;
  QWidget *this_00;
  QLayout *this_01;
  QArrayData *pQVar3;
  char cVar4;
  QWidget *pQVar5;
  Data *pDVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = (this->baseWidget).wp.d;
  if ((pDVar6 == (Data *)0x0) ||
     (pQVar2 = (this->baseWidget).wp.value, pQVar2 == (QObject *)0x0 || *(int *)(pDVar6 + 4) == 0))
  goto LAB_0044b9d4;
  pQVar1 = &this->baseWidget;
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QObject::removeEventFilter(pQVar2);
  this_01 = (this->super_QWidgetPrivate).layout;
  if (this_01 != (QLayout *)0x0) {
    pDVar6 = (pQVar1->wp).d;
    if ((pDVar6 == (Data *)0x0) || (*(int *)(pDVar6 + 4) == 0)) {
      pQVar5 = (QWidget *)0x0;
    }
    else {
      pQVar5 = (QWidget *)(this->baseWidget).wp.value;
    }
    QLayout::removeWidget(this_01,pQVar5);
  }
  QWidget::windowTitle(&local_58,(QWidget *)(this->baseWidget).wp.value);
  QWidget::windowTitle(&local_70,this_00);
  if (local_58.d.size == local_70.d.size) {
    QVar7.m_data = local_58.d.ptr;
    QVar7.m_size = local_58.d.size;
    QVar8.m_data = local_70.d.ptr;
    QVar8.m_size = local_58.d.size;
    cVar4 = QtPrivate::equalStrings(QVar7,QVar8);
  }
  else {
    cVar4 = '\0';
  }
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (cVar4 != '\0') {
    this->ignoreWindowTitleChange = true;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (storage_type_conflict *)0x0;
    local_58.d.size = 0;
    QWidget::setWindowTitle(this_00,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    this->ignoreWindowTitleChange = false;
    QWidget::setWindowModified(this_00,false);
  }
  if ((this->lastChildWindowTitle).d.ptr != (char16_t *)0x0) {
    pQVar3 = &((this->lastChildWindowTitle).d.d)->super_QArrayData;
    (this->lastChildWindowTitle).d.d = (Data *)0x0;
    (this->lastChildWindowTitle).d.ptr = (char16_t *)0x0;
    (this->lastChildWindowTitle).d.size = 0;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pDVar6 = (pQVar1->wp).d;
  if (pDVar6 == (Data *)0x0) {
    (pQVar1->wp).d = (Data *)0x0;
    (this->baseWidget).wp.value = (QObject *)0x0;
  }
  else {
    pQVar5 = (QWidget *)(this->baseWidget).wp.value;
    if (*(QWidget **)(*(long *)&pQVar5->field_0x8 + 0x10) == this_00) {
      QWidget::setParent(pQVar5,(QWidget *)0x0);
      pDVar6 = (pQVar1->wp).d;
      (pQVar1->wp).d = (Data *)0x0;
      (this->baseWidget).wp.value = (QObject *)0x0;
      if (pDVar6 == (Data *)0x0) goto LAB_0044b9cd;
    }
    else {
      (pQVar1->wp).d = (Data *)0x0;
      (this->baseWidget).wp.value = (QObject *)0x0;
    }
    LOCK();
    *(int *)pDVar6 = *(int *)pDVar6 + -1;
    UNLOCK();
    if (*(int *)pDVar6 == 0) {
      operator_delete(pDVar6);
    }
  }
LAB_0044b9cd:
  this->isWidgetHiddenByUs = false;
LAB_0044b9d4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::removeBaseWidget()
{
    if (!baseWidget)
        return;

    Q_Q(QMdiSubWindow);
    baseWidget->removeEventFilter(q);
    if (layout)
        layout->removeWidget(baseWidget);
    if (baseWidget->windowTitle() == q->windowTitle()) {
        ignoreWindowTitleChange = true;
        q->setWindowTitle(QString());
        ignoreWindowTitleChange = false;
        q->setWindowModified(false);
    }
    lastChildWindowTitle.clear();
    // QTBUG-47993: parent widget can be reset before this call
    if (baseWidget->parentWidget() == q)
        baseWidget->setParent(nullptr);
    baseWidget = nullptr;
    isWidgetHiddenByUs = false;
}